

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O0

void __thiscall streamer::Streamer::Streamer(Streamer *this)

{
  int iVar1;
  Streamer *this_local;
  
  Scaler::Scaler(&this->scaler);
  Picture::Picture(&this->picture);
  StreamerConfig::StreamerConfig(&this->config);
  this->format_ctx = (AVFormatContext *)0x0;
  this->out_codec = (AVCodec *)0x0;
  this->out_stream = (AVStream *)0x0;
  this->out_codec_ctx = (AVCodecContext *)0x0;
  this->rtmp_server_conn = false;
  av_register_all();
  this->inv_stream_timebase = 30.0;
  iVar1 = avformat_network_init();
  this->network_init_ok = (bool)((iVar1 != 0 ^ 0xffU) & 1);
  return;
}

Assistant:

Streamer::Streamer()
{
    format_ctx = nullptr;
    out_codec = nullptr;
    out_stream = nullptr;
    out_codec_ctx = nullptr;
    rtmp_server_conn = false;
    av_register_all();
    inv_stream_timebase = 30.0;
    network_init_ok = !avformat_network_init();
}